

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cc
# Opt level: O0

void __thiscall Object::internalProjection(Object *this,Vector2d *obs)

{
  size_type __n;
  bool bVar1;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *ppVar2;
  reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  unsigned_long *in_RDI;
  Edge *eg;
  Edge *this_edge;
  size_t i_1;
  size_t top;
  size_t i;
  HeapType heap;
  HeapType *in_stack_00000460;
  Edge *in_stack_00000468;
  Vector2d *in_stack_00000470;
  Edge *in_stack_00000478;
  Object *in_stack_00000480;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *this_00;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *this_01;
  EdgeCompFunctor *__x;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *in_stack_ffffffffffffff70;
  ulong local_80;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  *local_70;
  EdgeCompFunctor local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  local_38;
  
  this_01 = &local_38;
  EdgeCompFunctor::EdgeCompFunctor
            ((EdgeCompFunctor *)this_01,(vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2));
  local_58.egs = (vector<Edge,_std::allocator<Edge>_> *)0x0;
  uStack_50 = 0;
  local_48 = 0;
  __x = &local_58;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x148d8d);
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::priority_queue(in_stack_ffffffffffffff70,__x,&this_01->c);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff50);
  local_70 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
              *)0x0;
  while (this_00 = local_70,
        ppVar2 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                  *)std::vector<Edge,_std::allocator<Edge>_>::size
                              ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2)),
        this_00 < ppVar2) {
    pvVar3 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                       ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2),(size_type)local_70);
    if ((pvVar3->valid & 1U) != 0) {
      std::
      priority_queue<unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,EdgeCompFunctor>
      ::emplace<unsigned_long&>(this_01,in_RDI);
    }
    local_70 = (priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                *)((long)&(local_70->c).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
  }
  while (bVar1 = std::
                 priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                 ::empty((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                          *)0x148e72), !bVar1) {
    pvVar4 = std::
             priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
             ::top((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                    *)0x148e97);
    __n = *pvVar4;
    std::
    priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
    ::pop(this_00);
    for (local_80 = 0;
        sVar5 = std::vector<Edge,_std::allocator<Edge>_>::size
                          ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2)), local_80 < sVar5;
        local_80 = local_80 + 1) {
      pvVar3 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                         ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2),__n);
      pvVar6 = std::vector<Edge,_std::allocator<Edge>_>::operator[]
                         ((vector<Edge,_std::allocator<Edge>_> *)(in_RDI + 2),local_80);
      if (((pvVar6->valid & 1U) != 0) && (pvVar6 != pvVar3)) {
        printf("Source : %lu, dst: %lu\n",__n,local_80);
        projectEdge2Edge(in_stack_00000480,in_stack_00000478,in_stack_00000470,in_stack_00000468,
                         in_stack_00000460);
        printf("After Source : %lu, dst: %lu\n",__n,local_80);
      }
    }
  }
  std::
  priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
  ::~priority_queue((priority_queue<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_EdgeCompFunctor>
                     *)0x148fbb);
  return;
}

Assistant:

void Object::internalProjection(const Eigen::Vector2d& obs) {
    HeapType heap(edges);
    for (size_t i = 0; i < edges.size(); i++) {
        if (edges[i].valid)
            heap.emplace(i);
    }
    while (heap.empty() == false) {
        size_t top = heap.top();
        heap.pop();
        for (size_t i = 0; i < edges.size(); i++) {
            Edge& this_edge = edges[top];
            Edge& eg = edges[i];
            if (eg.valid == false || &eg == &this_edge)
                continue;
            printf("Source : %lu, dst: %lu\n", top, i);
            projectEdge2Edge(this_edge, obs, eg, heap);
            printf("After Source : %lu, dst: %lu\n", top, i);
        }
    }
}